

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stdlib.hpp
# Opt level: O0

void iutest::tuples::detail::
     tuple_foreach_impl<const_std::tuple<const_char_*,_const_char_*>,_iutest::detail::iuValueArray<const_char_*,_const_char_*>::make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_0>
     ::impl<2,_0>::do_something
               (tuple<const_char_*,_const_char_*> *t,
               make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *fn)

{
  __tuple_element_t<0UL,_tuple<const_char_*,_const_char_*>_> *value;
  make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *fn_local;
  tuple<const_char_*,_const_char_*> *t_local;
  
  value = std::get<0ul,char_const*,char_const*>(t);
  iutest::detail::iuValueArray<char_const*,char_const*>::make_array<std::__cxx11::string>::
  operator()(fn,0,value);
  impl<2,_1>::do_something(t,fn);
  return;
}

Assistant:

static void do_something(T& t, F fn)
        {
            fn(I, get<I>(t));
            impl<N, I + 1>::do_something(t, fn);
        }